

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1,false>
               (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                begin,__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                      end,anon_class_8_1_8991fb9c comp,int bad_allowed,bool leftmost)

{
  FractionalInteger *this;
  pointer ppVar1;
  double dVar2;
  undefined8 uVar3;
  pointer ppVar4;
  pointer ppVar5;
  anon_class_8_1_8991fb9c __comp;
  anon_class_8_1_8991fb9c __comp_00;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  _Var10;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  _Var11;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  _Var12;
  long lVar13;
  long lVar14;
  FractionalInteger *pFVar15;
  anon_class_8_1_8991fb9c comp_local;
  long local_d0;
  FractionalInteger *local_c8;
  int local_bc;
  FractionalInteger local_b8;
  FractionalInteger local_78;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_40;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_38;
  
  local_c8 = end._M_current + -1;
  local_38._M_current = end._M_current + -2;
  local_40._M_current = end._M_current + -3;
  comp_local.this = comp.this;
  local_bc = bad_allowed;
LAB_002ea896:
  do {
    local_d0 = (long)end._M_current - (long)begin._M_current;
    uVar7 = local_d0 / 0x38;
    if (local_d0 < 0x540) {
      if ((leftmost & 1U) == 0) {
        local_78.fractionality = (double)comp_local.this;
        if (begin._M_current != end._M_current) {
          while (pFVar15 = begin._M_current, begin._M_current = pFVar15 + 1,
                begin._M_current != end._M_current) {
            bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_8_1_8991fb9c::operator()
                              ((anon_class_8_1_8991fb9c *)&local_78,begin._M_current,pFVar15);
            if (bVar6) {
              local_b8.fractionality = (begin._M_current)->fractionality;
              local_b8._20_8_ = *(undefined8 *)((long)&pFVar15[1].score + 4);
              local_b8.score._0_4_ =
                   (undefined4)((ulong)*(undefined8 *)((long)&pFVar15[1].row_ep_norm2 + 4) >> 0x20);
              local_b8.row_ep_norm2._0_4_ = SUB84(pFVar15[1].row_ep_norm2,0);
              local_b8.row_ep_norm2._4_4_ = (undefined4)((ulong)pFVar15[1].row_ep_norm2 >> 0x20);
              local_b8.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   pFVar15[1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_b8.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   pFVar15[1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_b8.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   pFVar15[1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pFVar15[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              pFVar15[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              pFVar15[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pFVar15 = begin._M_current;
              do {
                this = pFVar15 + -1;
                FractionalInteger::operator=(pFVar15,this);
                bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_8_1_8991fb9c::
                        operator()((anon_class_8_1_8991fb9c *)&local_78,&local_b8,pFVar15 + -2);
                pFVar15 = pFVar15 + -1;
              } while (bVar6);
              FractionalInteger::operator=(this,&local_b8);
              std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
              ~_Vector_base(&local_b8.row_ep.
                             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           );
            }
          }
        }
      }
      else {
        local_78.fractionality = (double)comp_local.this;
        if (begin._M_current != end._M_current) {
          lVar14 = 0;
          _Var10._M_current = begin._M_current;
          while (pFVar15 = _Var10._M_current + 1, pFVar15 != end._M_current) {
            bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_8_1_8991fb9c::operator()
                              ((anon_class_8_1_8991fb9c *)&local_78,pFVar15,_Var10._M_current);
            if (bVar6) {
              local_b8.fractionality = pFVar15->fractionality;
              local_b8._20_8_ = *(undefined8 *)((long)&_Var10._M_current[1].score + 4);
              local_b8.score._0_4_ =
                   (undefined4)
                   ((ulong)*(undefined8 *)((long)&_Var10._M_current[1].row_ep_norm2 + 4) >> 0x20);
              local_b8.row_ep_norm2._0_4_ = SUB84(_Var10._M_current[1].row_ep_norm2,0);
              local_b8.row_ep_norm2._4_4_ =
                   (undefined4)((ulong)_Var10._M_current[1].row_ep_norm2 >> 0x20);
              local_b8.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   _Var10._M_current[1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_b8.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   _Var10._M_current[1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_b8.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   _Var10._M_current[1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              _Var10._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              _Var10._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              _Var10._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar13 = lVar14;
              do {
                FractionalInteger::operator=(_Var10._M_current + 1,_Var10._M_current);
                _Var12._M_current = begin._M_current;
                if (lVar13 == 0) break;
                bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_8_1_8991fb9c::
                        operator()((anon_class_8_1_8991fb9c *)&local_78,&local_b8,
                                   _Var10._M_current + -1);
                lVar13 = lVar13 + 0x38;
                _Var12._M_current = _Var10._M_current;
                _Var10._M_current = _Var10._M_current + -1;
              } while (bVar6);
              FractionalInteger::operator=(_Var12._M_current,&local_b8);
              std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
              ~_Vector_base(&local_b8.row_ep.
                             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           );
            }
            lVar14 = lVar14 + -0x38;
            _Var10._M_current = pFVar15;
          }
        }
      }
      return;
    }
    uVar9 = uVar7 >> 1;
    _Var10._M_current = begin._M_current + uVar9;
    if (uVar7 < 0x81) {
      sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                (_Var10,begin,
                 (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                  )local_c8,comp_local);
    }
    else {
      sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                (begin,_Var10,
                 (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                  )local_c8,comp_local);
      sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                (begin._M_current + 1,begin._M_current + (uVar9 - 1),local_38,comp_local);
      sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                (begin._M_current + 2,begin._M_current + uVar9 + 1,local_40,comp_local);
      sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                (begin._M_current + (uVar9 - 1),_Var10,begin._M_current + uVar9 + 1,comp_local);
      std::swap<FractionalInteger>(begin._M_current,_Var10._M_current);
    }
    if (((leftmost & 1U) == 0) &&
       (bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_8_1_8991fb9c::operator()
                          (&comp_local,begin._M_current + -1,begin._M_current), !bVar6)) {
      local_78.fractionality = (double)comp_local.this;
      local_b8.fractionality = (begin._M_current)->fractionality;
      local_b8._20_8_ = *(undefined8 *)((long)&(begin._M_current)->score + 4);
      local_b8.score._0_4_ =
           (undefined4)((ulong)*(undefined8 *)((long)&(begin._M_current)->row_ep_norm2 + 4) >> 0x20)
      ;
      local_b8.row_ep_norm2._0_4_ = SUB84((begin._M_current)->row_ep_norm2,0);
      local_b8.row_ep_norm2._4_4_ = (undefined4)((ulong)(begin._M_current)->row_ep_norm2 >> 0x20);
      local_b8.row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start =
           ((begin._M_current)->row_ep).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_b8.row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish =
           ((begin._M_current)->row_ep).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_b8.row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           ((begin._M_current)->row_ep).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      ((begin._M_current)->row_ep).
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ((begin._M_current)->row_ep).
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ((begin._M_current)->row_ep).
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      lVar14 = -0x38;
      _Var10._M_current = end._M_current;
      do {
        _Var10._M_current = _Var10._M_current + -1;
        bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)&local_78,&local_b8,_Var10._M_current);
        lVar14 = lVar14 + 0x38;
      } while (bVar6);
      _Var12._M_current = begin._M_current;
      if (lVar14 == 0) {
        do {
          if (_Var10._M_current <= _Var12._M_current) break;
          _Var12._M_current = _Var12._M_current + 1;
          bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_8_1_8991fb9c::operator()
                            ((anon_class_8_1_8991fb9c *)&local_78,&local_b8,_Var12._M_current);
        } while (!bVar6);
      }
      else {
        do {
          _Var12._M_current = _Var12._M_current + 1;
          bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_8_1_8991fb9c::operator()
                            ((anon_class_8_1_8991fb9c *)&local_78,&local_b8,_Var12._M_current);
        } while (!bVar6);
      }
      while (_Var12._M_current < _Var10._M_current) {
        std::swap<FractionalInteger>(_Var12._M_current,_Var10._M_current);
        do {
          _Var10._M_current = _Var10._M_current + -1;
          bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_8_1_8991fb9c::operator()
                            ((anon_class_8_1_8991fb9c *)&local_78,&local_b8,_Var10._M_current);
        } while (bVar6);
        do {
          _Var12._M_current = _Var12._M_current + 1;
          bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_8_1_8991fb9c::operator()
                            ((anon_class_8_1_8991fb9c *)&local_78,&local_b8,_Var12._M_current);
        } while (!bVar6);
      }
      FractionalInteger::operator=(begin._M_current,_Var10._M_current);
      FractionalInteger::operator=(_Var10._M_current,&local_b8);
      std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      ~_Vector_base(&local_b8.row_ep.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   );
      begin._M_current = _Var10._M_current + 1;
      goto LAB_002ea896;
    }
    local_78.fractionality = (double)comp_local.this;
    local_b8.fractionality = (begin._M_current)->fractionality;
    local_b8._20_8_ = *(undefined8 *)((long)&(begin._M_current)->score + 4);
    local_b8.score._0_4_ =
         (undefined4)((ulong)*(undefined8 *)((long)&(begin._M_current)->row_ep_norm2 + 4) >> 0x20);
    local_b8.row_ep_norm2._0_4_ = SUB84((begin._M_current)->row_ep_norm2,0);
    local_b8.row_ep_norm2._4_4_ = (undefined4)((ulong)(begin._M_current)->row_ep_norm2 >> 0x20);
    local_b8.row_ep.
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_start =
         ((begin._M_current)->row_ep).
         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_b8.row_ep.
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         ((begin._M_current)->row_ep).
         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_b8.row_ep.
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         ((begin._M_current)->row_ep).
         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    ((begin._M_current)->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((begin._M_current)->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((begin._M_current)->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar14 = 0x38;
    _Var10._M_current = begin._M_current;
    do {
      _Var10._M_current = _Var10._M_current + 1;
      bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)&local_78,_Var10._M_current,&local_b8);
      lVar14 = lVar14 + -0x38;
    } while (bVar6);
    _Var12._M_current = end._M_current;
    _Var11._M_current = _Var10._M_current;
    if (lVar14 == 0) {
      do {
        pFVar15 = _Var12._M_current;
        if (_Var12._M_current <= _Var10._M_current) break;
        _Var12._M_current = _Var12._M_current + -1;
        bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)&local_78,_Var12._M_current,&local_b8);
        pFVar15 = _Var12._M_current;
      } while (!bVar6);
    }
    else {
      do {
        _Var12._M_current = _Var12._M_current + -1;
        bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)&local_78,_Var12._M_current,&local_b8);
        pFVar15 = _Var12._M_current;
      } while (!bVar6);
    }
    while (_Var11._M_current < _Var12._M_current) {
      std::swap<FractionalInteger>(_Var11._M_current,_Var12._M_current);
      do {
        _Var11._M_current = _Var11._M_current + 1;
        bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)&local_78,_Var11._M_current,&local_b8);
      } while (bVar6);
      do {
        _Var12._M_current = _Var12._M_current + -1;
        bVar6 = HighsTableauSeparator::separateLpSolution::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)&local_78,_Var12._M_current,&local_b8);
      } while (!bVar6);
    }
    _Var12._M_current = _Var11._M_current + -1;
    FractionalInteger::operator=(begin._M_current,_Var12._M_current);
    FractionalInteger::operator=(_Var12._M_current,&local_b8);
    std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
    ~_Vector_base(&local_b8.row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 );
    __comp = comp_local;
    uVar9 = ((long)_Var12._M_current - (long)begin._M_current) / 0x38;
    uVar8 = ((long)end._M_current - (long)_Var11._M_current) / 0x38;
    if (((long)uVar9 < (long)(uVar7 >> 3)) || ((long)uVar8 < (long)(uVar7 >> 3))) {
      local_bc = local_bc + -1;
      if (local_bc == 0) {
        uVar9 = uVar7 - 2 >> 1;
        pFVar15 = begin._M_current + uVar9;
        do {
          local_b8.fractionality = pFVar15->fractionality;
          local_b8._20_8_ = *(undefined8 *)((long)&pFVar15->score + 4);
          local_b8.score._0_4_ =
               (undefined4)((ulong)*(undefined8 *)((long)&pFVar15->row_ep_norm2 + 4) >> 0x20);
          local_b8.row_ep_norm2._0_4_ = SUB84(pFVar15->row_ep_norm2,0);
          local_b8.row_ep_norm2._4_4_ = (undefined4)((ulong)pFVar15->row_ep_norm2 >> 0x20);
          local_78.row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pFVar15->row_ep).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          local_78.fractionality = pFVar15->fractionality;
          dVar2 = pFVar15->row_ep_norm2;
          uVar3 = *(undefined8 *)((long)&pFVar15->row_ep_norm2 + 4);
          local_78._20_8_ = *(undefined8 *)((long)&pFVar15->score + 4);
          local_78.row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pFVar15->row_ep).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
          local_78.row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               (pFVar15->row_ep).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          (pFVar15->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pFVar15->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pFVar15->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_78.score._0_4_ = (undefined4)((ulong)uVar3 >> 0x20);
          local_78.row_ep_norm2._0_4_ = SUB84(dVar2,0);
          local_78.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar2 >> 0x20);
          local_b8.row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_b8.row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_b8.row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,long,FractionalInteger,__gnu_cxx::__ops::_Iter_comp_iter<HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>>
                    (begin,uVar9,uVar7,&local_78,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsTableauSeparator_cpp:124:11)>
                      )__comp.this);
          std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          ~_Vector_base(&local_78.row_ep.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       );
          std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          ~_Vector_base(&local_b8.row_ep.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       );
          __comp_00 = comp_local;
          pFVar15 = pFVar15 + -1;
          bVar6 = uVar9 != 0;
          uVar9 = uVar9 - 1;
        } while (bVar6);
        while (0x38 < local_d0) {
          local_b8.fractionality = local_c8->fractionality;
          local_b8._20_8_ = *(undefined8 *)((long)&local_c8->score + 4);
          local_b8.score._0_4_ =
               (undefined4)((ulong)*(undefined8 *)((long)&local_c8->row_ep_norm2 + 4) >> 0x20);
          local_b8.row_ep_norm2._0_4_ = SUB84(local_c8->row_ep_norm2,0);
          local_b8.row_ep_norm2._4_4_ = (undefined4)((ulong)local_c8->row_ep_norm2 >> 0x20);
          ppVar1 = (local_c8->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_d0 = local_d0 + -0x38;
          ppVar4 = (local_c8->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar5 = (local_c8->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          (local_c8->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (local_c8->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (local_c8->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          FractionalInteger::operator=(local_c8,begin._M_current);
          local_78.fractionality = local_b8.fractionality;
          local_78.row_ep_norm2._0_4_ = local_b8.row_ep_norm2._0_4_;
          local_78.row_ep_norm2._4_4_ = local_b8.row_ep_norm2._4_4_;
          local_78.score._0_4_ = local_b8.score._0_4_;
          local_78._20_8_ = local_b8._20_8_;
          local_b8.row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_b8.row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_b8.row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_78.row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = ppVar4;
          local_78.row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar5;
          local_78.row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar1;
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,long,FractionalInteger,__gnu_cxx::__ops::_Iter_comp_iter<HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>>
                    (begin,0,local_d0 / 0x38,&local_78,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsTableauSeparator_cpp:124:11)>
                      )__comp_00.this);
          std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          ~_Vector_base(&local_78.row_ep.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       );
          std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          ~_Vector_base(&local_b8.row_ep.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       );
          local_c8 = local_c8 + -1;
        }
        return;
      }
      if (0x508 < (long)_Var12._M_current - (long)begin._M_current) {
        uVar7 = uVar9 >> 2;
        std::swap<FractionalInteger>(begin._M_current,begin._M_current + uVar7);
        std::swap<FractionalInteger>(_Var11._M_current + -2,_Var12._M_current + -uVar7);
        if (0x80 < uVar9) {
          std::swap<FractionalInteger>(begin._M_current + 1,begin._M_current + uVar7 + 1);
          std::swap<FractionalInteger>(begin._M_current + 2,begin._M_current + uVar7 + 2);
          std::swap<FractionalInteger>(_Var11._M_current + -3,_Var12._M_current + ~uVar7);
          std::swap<FractionalInteger>(_Var11._M_current + -4,_Var12._M_current + (-2 - uVar7));
        }
      }
      if (0x508 < (long)end._M_current - (long)_Var11._M_current) {
        uVar7 = uVar8 >> 2;
        std::swap<FractionalInteger>(_Var11._M_current,_Var11._M_current + uVar7);
        std::swap<FractionalInteger>(local_c8,end._M_current + -uVar7);
        if (0x80 < uVar8) {
          std::swap<FractionalInteger>(_Var11._M_current + 1,_Var12._M_current + uVar7 + 2);
          std::swap<FractionalInteger>(_Var11._M_current + 2,_Var12._M_current + uVar7 + 3);
          std::swap<FractionalInteger>(local_38._M_current,end._M_current + ~uVar7);
          std::swap<FractionalInteger>(local_40._M_current,end._M_current + (-2 - uVar7));
        }
      }
    }
    else if (((pFVar15 <= _Var10._M_current) &&
             (bVar6 = partial_insertion_sort<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                                (begin,_Var12,comp_local), bVar6)) &&
            (bVar6 = partial_insertion_sort<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                               (_Var11,end,comp_local), bVar6)) {
      return;
    }
    pdqsort_loop<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1,false>
              (begin,_Var12,comp_local,local_bc,(bool)(leftmost & 1));
    leftmost = false;
    begin._M_current = _Var11._M_current;
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }